

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O2

void __thiscall mocker::ast::ClassDecl::~ClassDecl(ClassDecl *this)

{
  (this->super_Declaration).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ClassDecl_001f37a8;
  std::
  vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
  ::~vector(&this->members);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->identifier).
              super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_Declaration).super_ASTNode.
              super_enable_shared_from_this<mocker::ast::ASTNode>._M_weak_this.
              super___weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

ClassDecl(std::shared_ptr<Identifier> identifier,
            std::vector<std::shared_ptr<Declaration>> members)
      : identifier(std::move(identifier)), members(std::move(members)) {}